

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O0

int4 __thiscall XmlScan::scanCData(XmlScan *this)

{
  bool bVar1;
  int4 iVar2;
  string *this_00;
  XmlScan *this_local;
  
  clearlvalue(this);
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00);
  this->lvalue = (string *)this_00;
  while ((iVar2 = next(this,0), iVar2 != -1 &&
         (((iVar2 = next(this,0), iVar2 != 0x5d || (iVar2 = next(this,1), iVar2 != 0x5d)) ||
          (iVar2 = next(this,2), iVar2 != 0x3e))))) {
    iVar2 = next(this,0);
    bVar1 = isChar(this,iVar2);
    if (!bVar1) {
      return 0x103;
    }
    iVar2 = getxmlchar(this);
    std::__cxx11::string::operator+=((string *)this->lvalue,(char)iVar2);
  }
  return 0x103;
}

Assistant:

int4 XmlScan::scanCData(void)

{				// Look for "]]>" and non-Char
  clearlvalue();
  lvalue = new string();

  while(next(0) != -1) {
    if (next(0)==']')
      if (next(1)==']')
	if (next(2)=='>')
	  break;
    if (!isChar(next(0))) break;
    *lvalue += getxmlchar();
  }
  return CDataToken;		// CData can be empty
}